

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

idx_t duckdb::BinaryExecutor::
      SelectFlat<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::Equals,true,false>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  SelectionVector *true_sel_00;
  uhugeint_t *mask;
  SelectionVector *in_RCX;
  SelectionVector *in_RDX;
  long in_R9;
  idx_t i;
  uhugeint_t *rdata;
  uhugeint_t *ldata;
  idx_t in_stack_ffffffffffffff80;
  idx_t in_stack_ffffffffffffff88;
  SelectionVector *in_stack_ffffffffffffff90;
  uhugeint_t *in_stack_ffffffffffffffa0;
  uhugeint_t *in_stack_ffffffffffffffa8;
  SelectionVector *local_50;
  SelectionVector *false_sel_00;
  idx_t local_8;
  
  true_sel_00 = (SelectionVector *)FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x69efff);
  mask = FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x69f00e);
  bVar1 = ConstantVector::IsNull((Vector *)0x69f01d);
  if (bVar1) {
    if (in_R9 != 0) {
      for (local_50 = (SelectionVector *)0x0; local_50 < in_RCX;
          local_50 = (SelectionVector *)((long)&local_50->sel_vector + 1)) {
        SelectionVector::get_index(in_RDX,(idx_t)local_50);
        SelectionVector::set_index
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
    }
    local_8 = 0;
  }
  else {
    false_sel_00 = true_sel_00;
    FlatVector::Validity((Vector *)0x69f0c7);
    local_8 = SelectFlatLoopSwitch<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::Equals,true,false>
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_RCX,(idx_t)in_RDX,
                         (ValidityMask *)mask,true_sel_00,false_sel_00);
  }
  return local_8;
}

Assistant:

static idx_t SelectFlat(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                        SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if (LEFT_CONSTANT && ConstantVector::IsNull(left)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		}
		if (RIGHT_CONSTANT && ConstantVector::IsNull(right)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		}

		if (LEFT_CONSTANT) {
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, FlatVector::Validity(right), true_sel, false_sel);
		} else if (RIGHT_CONSTANT) {
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, FlatVector::Validity(left), true_sel, false_sel);
		} else {
			ValidityMask combined_mask = FlatVector::Validity(left);
			combined_mask.Combine(FlatVector::Validity(right), count);
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, combined_mask, true_sel, false_sel);
		}
	}